

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O0

Bool Finalize_Profile_Table(black_PWorker worker)

{
  Bool BVar1;
  int local_30;
  Int local_2c;
  Int top;
  Int bottom;
  PProfile_conflict p;
  UShort n;
  black_PWorker worker_local;
  
  p._6_2_ = worker->num_Profs;
  _top = worker->fProfile;
  if ((p._6_2_ < 2) || (_top == (PProfile_conflict)0x0)) {
    worker->fProfile = (PProfile_conflict)0x0;
  }
  else {
    do {
      if (p._6_2_ < 2) {
        _top->link = (PProfile)0x0;
      }
      else {
        _top->link = (PProfile)(_top->offset + _top->height);
      }
      if ((_top->flags & 8) == 0) {
        local_2c = ((int)_top->start - (int)_top->height) + 1;
        local_30 = (int)_top->start;
        _top->start = (long)local_2c;
        _top->offset = _top->offset + _top->height + -1;
      }
      else {
        local_2c = (Int)_top->start;
        local_30 = (int)_top->start + (int)_top->height + -1;
      }
      BVar1 = Insert_Y_Turn(worker,local_2c);
      if ((BVar1 != '\0') || (BVar1 = Insert_Y_Turn(worker,local_30 + 1), BVar1 != '\0')) {
        return '\x01';
      }
      _top = _top->link;
      p._6_2_ = p._6_2_ - 1;
    } while (p._6_2_ != 0);
  }
  return '\0';
}

Assistant:

static Bool
  Finalize_Profile_Table( RAS_ARG )
  {
    UShort    n;
    PProfile  p;


    n = ras.num_Profs;
    p = ras.fProfile;

    if ( n > 1 && p )
    {
      do
      {
        Int  bottom, top;


        if ( n > 1 )
          p->link = (PProfile)( p->offset + p->height );
        else
          p->link = NULL;

        if ( p->flags & Flow_Up )
        {
          bottom = (Int)p->start;
          top    = (Int)( p->start + p->height - 1 );
        }
        else
        {
          bottom     = (Int)( p->start - p->height + 1 );
          top        = (Int)p->start;
          p->start   = bottom;
          p->offset += p->height - 1;
        }

        if ( Insert_Y_Turn( RAS_VARS bottom )  ||
             Insert_Y_Turn( RAS_VARS top + 1 ) )
          return FAILURE;

        p = p->link;
      } while ( --n );
    }
    else
      ras.fProfile = NULL;

    return SUCCESS;
  }